

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginVST2.cpp
# Opt level: O0

void __thiscall
DISTRHO::PluginVst::PluginVst(PluginVst *this,audioMasterCallback audioMaster,AEffect *effect)

{
  uint32_t uVar1;
  float *pfVar2;
  uint local_34;
  uint32_t i;
  uint32_t parameterCount;
  AEffect *effect_local;
  audioMasterCallback audioMaster_local;
  PluginVst *this_local;
  
  ParameterAndNotesHelper::ParameterAndNotesHelper(&this->super_ParameterAndNotesHelper);
  (this->super_ParameterAndNotesHelper)._vptr_ParameterAndNotesHelper =
       (_func_int **)&PTR__PluginVst_0011dc60;
  PluginExporter::PluginExporter
            (&this->fPlugin,this,(writeMidiFunc)0x0,(requestParameterValueChangeFunc)0x0);
  this->fAudioMaster = audioMaster;
  this->fEffect = effect;
  memset(this->fProgramName,0,0x21);
  strcpy(this->fProgramName,"Default");
  uVar1 = PluginExporter::getParameterCount(&this->fPlugin);
  if (uVar1 != 0) {
    pfVar2 = (float *)operator_new__((ulong)uVar1 << 2);
    (this->super_ParameterAndNotesHelper).parameterValues = pfVar2;
    for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
      (this->super_ParameterAndNotesHelper).parameterValues[local_34] = NAN;
    }
  }
  return;
}

Assistant:

PluginVst(const audioMasterCallback audioMaster, AEffect* const effect)
        : fPlugin(this, writeMidiCallback, requestParameterValueChangeCallback),
          fAudioMaster(audioMaster),
          fEffect(effect)
    {
        std::memset(fProgramName, 0, sizeof(char)*(32+1));
        std::strcpy(fProgramName, "Default");

        const uint32_t parameterCount = fPlugin.getParameterCount();

        if (parameterCount != 0)
        {
            parameterValues = new float[parameterCount];

            for (uint32_t i=0; i < parameterCount; ++i)
                parameterValues[i] = NAN;
        }

#if DISTRHO_PLUGIN_WANT_MIDI_INPUT
        fMidiEventCount = 0;
#endif

#if DISTRHO_PLUGIN_HAS_UI
        fVstUI           = nullptr;
        fVstRect.top     = 0;
        fVstRect.left    = 0;
        fVstRect.bottom  = 0;
        fVstRect.right   = 0;
        fLastScaleFactor = 0.0f;

        if (parameterCount != 0)
        {
            parameterChecks = new bool[parameterCount];
            memset(parameterChecks, 0, sizeof(bool)*parameterCount);
        }

# if DISTRHO_OS_MAC
#  ifdef __LP64__
        fUsingNsView = true;
#  else
#   ifndef DISTRHO_NO_WARNINGS
#    warning 32bit VST UIs on OSX only work if the host supports "hasCockosViewAsConfig"
#   endif
        fUsingNsView = false;
#  endif
# endif // DISTRHO_OS_MAC

# if DISTRHO_PLUGIN_WANT_MIDI_INPUT
        fNotesRingBuffer.setRingBuffer(&notesRingBuffer, true);
# endif
#endif // DISTRHO_PLUGIN_HAS_UI

#if DISTRHO_PLUGIN_WANT_STATE
        fStateChunk = nullptr;

        for (uint32_t i=0, count=fPlugin.getStateCount(); i<count; ++i)
        {
            const String& dkey(fPlugin.getStateKey(i));
            fStateMap[dkey] = fPlugin.getStateDefaultValue(i);
        }
#endif
    }